

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_FLIPPT(TT_ExecContext exc)

{
  FT_Byte *pFVar1;
  ulong uVar2;
  FT_UShort point;
  TT_ExecContext exc_local;
  
  if ((((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
       (exc->backward_compatibility == '\0')) || (exc->iupx_called == '\0')) ||
     (exc->iupy_called == '\0')) {
    if (exc->top < (exc->GS).loop) {
      if (exc->pedantic_hinting != '\0') {
        exc->error = 0x81;
      }
    }
    else {
      while (0 < (exc->GS).loop) {
        exc->args = exc->args + -1;
        if ((ushort)exc->stack[exc->args] < (exc->pts).n_points) {
          pFVar1 = (exc->pts).tags;
          uVar2 = exc->stack[exc->args] & 0xffff;
          pFVar1[uVar2] = pFVar1[uVar2] ^ 1;
        }
        else if (exc->pedantic_hinting != '\0') {
          exc->error = 0x86;
          return;
        }
        (exc->GS).loop = (exc->GS).loop + -1;
      }
    }
  }
  (exc->GS).loop = 1;
  exc->new_top = exc->args;
  return;
}

Assistant:

static void
  Ins_FLIPPT( TT_ExecContext  exc )
  {
    FT_UShort  point;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    /* See `ttinterp.h' for details on backward compatibility mode. */
    if ( SUBPIXEL_HINTING_MINIMAL    &&
         exc->backward_compatibility &&
         exc->iupx_called            &&
         exc->iupy_called            )
      goto Fail;
#endif

    if ( exc->top < exc->GS.loop )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Too_Few_Arguments );
      goto Fail;
    }

    while ( exc->GS.loop > 0 )
    {
      exc->args--;

      point = (FT_UShort)exc->stack[exc->args];

      if ( BOUNDS( point, exc->pts.n_points ) )
      {
        if ( exc->pedantic_hinting )
        {
          exc->error = FT_THROW( Invalid_Reference );
          return;
        }
      }
      else
        exc->pts.tags[point] ^= FT_CURVE_TAG_ON;

      exc->GS.loop--;
    }

  Fail:
    exc->GS.loop = 1;
    exc->new_top = exc->args;
  }